

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

HelicsFilter
helicsCoreRegisterFilter(HelicsCore core,HelicsFilterTypes type,char *name,HelicsError *err)

{
  bool bVar1;
  pointer this;
  pointer pFVar2;
  allocator<char> *in_RDX;
  int in_ESI;
  __single_object filt;
  shared_ptr<helics::Core> corePtr;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  HelicsError *in_stack_ffffffffffffff20;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *this_00;
  HelicsCore in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  char *__s;
  undefined4 in_stack_ffffffffffffff50;
  int iVar3;
  undefined6 in_stack_ffffffffffffff68;
  byte bVar4;
  allocator<char> in_stack_ffffffffffffff6f;
  Core *in_stack_ffffffffffffff70;
  FilterTypes in_stack_ffffffffffffff7c;
  string_view in_stack_ffffffffffffff80;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> local_48;
  undefined4 local_3c;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_38;
  allocator<char> *local_20;
  int local_14;
  HelicsFilter local_8;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  getCoreSharedPtr(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_38);
  if (bVar1) {
    std::make_unique<helics::FilterObject>();
    iVar3 = local_14;
    std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get(&local_38);
    bVar4 = 0;
    if (local_20 == (allocator<char> *)0x0) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar3,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48);
    }
    else {
      __s = &stack0xffffffffffffff6f;
      std::allocator<char>::allocator();
      bVar4 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar3,in_stack_ffffffffffffff50),__s,local_20);
    }
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff10);
    helics::make_filter(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffff80);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::operator->
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               0x1e5c32);
    std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>::operator=
              ((unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
               in_stack_ffffffffffffff10,
               (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
               in_stack_ffffffffffffff08);
    std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>::~unique_ptr
              ((unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
               in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(in_stack_ffffffffffffff10);
    if ((bVar4 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    }
    this_00 = &local_48;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::operator->
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               0x1e5c82);
    this = std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>::get
                     ((unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
                      in_stack_ffffffffffffff10);
    pFVar2 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e5c9d);
    pFVar2->filtPtr = this;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::operator->
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               0x1e5cb0);
    std::shared_ptr<helics::Core>::operator=
              ((shared_ptr<helics::Core> *)this,in_stack_ffffffffffffff08);
    pFVar2 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e5cd9);
    pFVar2->custom = local_14 == 0;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::unique_ptr
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)this,
               (unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               in_stack_ffffffffffffff08);
    local_8 = anon_unknown.dwarf_88686::coreAddFilter
                        (in_stack_ffffffffffffff70,
                         (unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                          *)CONCAT17(in_stack_ffffffffffffff6f,
                                     CONCAT16(bVar4,in_stack_ffffffffffffff68)));
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (this_00);
    local_3c = 1;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (this_00);
  }
  else {
    local_8 = (HelicsFilter)0x0;
    local_3c = 1;
  }
  std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x1e5e42);
  return local_8;
}

Assistant:

HelicsFilter helicsCoreRegisterFilter(HelicsCore core, HelicsFilterTypes type, const char* name, HelicsError* err)
{
    auto corePtr = getCoreSharedPtr(core, err);
    if (!corePtr) {
        return nullptr;
    }
    try {
        auto filt = std::make_unique<helics::FilterObject>();
        filt->uFilter = helics::make_filter(static_cast<helics::FilterTypes>(type), corePtr.get(), AS_STRING(name));
        filt->filtPtr = filt->uFilter.get();
        filt->corePtr = std::move(corePtr);
        filt->custom = (type == HELICS_FILTER_TYPE_CUSTOM);
        return coreAddFilter(core, std::move(filt));
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}